

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CborMap::Put::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  anon_class_1_0_00000001 *this_local;
  
  return;
}

Assistant:

Error CborMap::Get(int aKey, CborMap &aMap) const
{
    cn_cbor *cbor = cn_cbor_mapget_int(mCbor, aKey);
    if (cbor == nullptr)
    {
        return ERROR_NOT_FOUND("CBOR map cannot find entry of {}", aKey);
    }

    aMap.mIsRoot = false;
    aMap.mCbor   = cbor;
    return ERROR_NONE;
}